

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucmndata.cpp
# Opt level: O2

int32_t strcmpAfterPrefix(char *s1,char *s2,int32_t *pPrefixLength)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = *pPrefixLength;
  lVar4 = 0;
  do {
    bVar1 = s1[lVar4 + iVar3];
    bVar2 = s2[lVar4 + iVar3];
    lVar4 = lVar4 + 1;
    if (bVar1 == 0) break;
  } while (bVar1 == bVar2);
  *pPrefixLength = iVar3 + (int)lVar4 + -1;
  return (uint)bVar1 - (uint)bVar2;
}

Assistant:

static int32_t
strcmpAfterPrefix(const char *s1, const char *s2, int32_t *pPrefixLength) {
    int32_t pl=*pPrefixLength;
    int32_t cmp=0;
    s1+=pl;
    s2+=pl;
    for(;;) {
        int32_t c1=(uint8_t)*s1++;
        int32_t c2=(uint8_t)*s2++;
        cmp=c1-c2;
        if(cmp!=0 || c1==0) {  /* different or done */
            break;
        }
        ++pl;  /* increment shared same-prefix length */
    }
    *pPrefixLength=pl;
    return cmp;
}